

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O1

Vec_Vec_t * Gia_ManAssignCodes(int kHot,int nStates,int *pnBits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Vec_Vec_t *p;
  void **ppvVar7;
  undefined8 *puVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint Entry;
  uint uVar13;
  
  if (nStates < 1) {
    __assert_fail("nStates > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x71,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
  }
  if (4 < kHot - 1U) {
    __assert_fail("kHot >= 1 && kHot <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x72,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
  }
  p = (Vec_Vec_t *)malloc(0x10);
  uVar11 = 8;
  if (8 < (uint)nStates) {
    uVar11 = (ulong)(uint)nStates;
  }
  p->nSize = 0;
  p->nCap = (int)uVar11;
  ppvVar7 = (void **)malloc(uVar11 << 3);
  p->pArray = ppvVar7;
  uVar11 = 0;
  do {
    puVar8 = (undefined8 *)malloc(0x10);
    *puVar8 = 0;
    puVar8[1] = 0;
    ppvVar7[uVar11] = puVar8;
    uVar11 = uVar11 + 1;
  } while ((uint)nStates != uVar11);
  p->nSize = nStates;
  *pnBits = -1;
  uVar10 = kHot;
  switch(kHot - 1U) {
  case 0:
    iVar9 = 0;
    do {
      Vec_VecPushInt(p,iVar9,iVar9);
      iVar9 = iVar9 + 1;
    } while (nStates != iVar9);
    *pnBits = nStates;
    return p;
  case 1:
    uVar13 = kHot;
    do {
      if (nStates <= (int)((uVar13 - 1) * uVar13) / 2) goto LAB_007d4330;
      uVar13 = uVar13 + 1;
    } while (uVar13 != 1000000000);
    uVar13 = 1000000000;
LAB_007d4330:
    *pnBits = uVar13;
    iVar9 = 0;
    uVar1 = 0;
    do {
      uVar5 = uVar1 + 1;
      uVar3 = uVar5;
      if (uVar5 < uVar13) {
        do {
          Vec_VecPushInt(p,iVar9,uVar1);
          Vec_VecPushInt(p,iVar9,uVar3);
          if (nStates + -1 == iVar9) {
            return p;
          }
          uVar3 = uVar3 + 1;
          iVar9 = iVar9 + 1;
        } while (uVar13 != uVar3);
      }
      uVar1 = uVar5;
    } while (uVar5 != uVar13);
    if (kHot == 3) goto switchD_007d42cf_caseD_2;
    break;
  case 2:
switchD_007d42cf_caseD_2:
    uVar13 = kHot;
    do {
      if (nStates <= (int)((uVar13 - 2) * (uVar13 - 1) * uVar13) / 6) goto LAB_007d43e9;
      uVar13 = uVar13 + 1;
    } while (uVar13 != 1000000000);
    uVar13 = 1000000000;
LAB_007d43e9:
    *pnBits = uVar13;
    iVar9 = 0;
    uVar1 = 0;
    do {
      uVar5 = uVar1 + 1;
      uVar3 = uVar5;
      if (uVar5 < uVar13) {
        do {
          uVar2 = uVar3 + 1;
          for (uVar4 = uVar2; uVar4 < uVar13; uVar4 = uVar4 + 1) {
            Vec_VecPushInt(p,iVar9,uVar1);
            Vec_VecPushInt(p,iVar9,uVar3);
            Vec_VecPushInt(p,iVar9,uVar4);
            if (nStates + -1 == iVar9) {
              return p;
            }
            iVar9 = iVar9 + 1;
          }
          uVar3 = uVar2;
        } while (uVar2 != uVar13);
      }
      uVar1 = uVar5;
    } while (uVar5 != uVar13);
    break;
  case 3:
    goto switchD_007d42cf_caseD_3;
  case 4:
    goto switchD_007d42cf_caseD_4;
  default:
    goto switchD_007d42cf_default;
  }
  if (kHot == 4) {
switchD_007d42cf_caseD_3:
    do {
      if (nStates <= (int)((uVar10 - 3) * (uVar10 - 2) * (uVar10 - 1) * uVar10) / 0x18)
      goto LAB_007d44c6;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 1000000000);
    uVar10 = 1000000000;
LAB_007d44c6:
    *pnBits = uVar10;
    iVar9 = 0;
    uVar13 = 0;
    do {
      uVar3 = uVar13 + 1;
      uVar1 = uVar3;
      if (uVar3 < uVar10) {
        do {
          uVar4 = uVar1 + 1;
          uVar5 = uVar4;
          while (uVar2 = uVar5, uVar2 < uVar10) {
            uVar5 = uVar2 + 1;
            uVar12 = uVar5;
            if (uVar5 < uVar10) {
              do {
                Vec_VecPushInt(p,iVar9,uVar13);
                Vec_VecPushInt(p,iVar9,uVar1);
                Vec_VecPushInt(p,iVar9,uVar2);
                Vec_VecPushInt(p,iVar9,uVar12);
                if (nStates + -1 == iVar9) {
                  return p;
                }
                uVar12 = uVar12 + 1;
                iVar9 = iVar9 + 1;
              } while ((int)uVar12 < (int)uVar10);
            }
          }
          uVar1 = uVar4;
        } while (uVar4 != uVar10);
      }
      uVar13 = uVar3;
    } while (uVar3 != uVar10);
    uVar10 = 5;
  }
  if (kHot == 5) {
switchD_007d42cf_caseD_4:
    do {
      if (nStates <=
          (int)((uVar10 - 4) * (uVar10 - 3) * (uVar10 - 2) * (uVar10 - 1) * uVar10) / 0x78)
      goto LAB_007d45d1;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 1000000000);
    uVar10 = 1000000000;
LAB_007d45d1:
    *pnBits = uVar10;
    iVar9 = 0;
    uVar13 = 0;
    do {
      uVar3 = uVar13 + 1;
      uVar1 = uVar3;
      if (uVar3 < uVar10) {
        do {
          uVar4 = uVar1 + 1;
          uVar5 = uVar4;
          while (uVar2 = uVar5, uVar2 < uVar10) {
            uVar5 = uVar2 + 1;
            uVar12 = uVar5;
            if (uVar5 < uVar10) {
              do {
                uVar6 = uVar12 + 1;
                for (Entry = uVar6; (int)Entry < (int)uVar10; Entry = Entry + 1) {
                  Vec_VecPushInt(p,iVar9,uVar13);
                  Vec_VecPushInt(p,iVar9,uVar1);
                  Vec_VecPushInt(p,iVar9,uVar2);
                  Vec_VecPushInt(p,iVar9,uVar12);
                  Vec_VecPushInt(p,iVar9,Entry);
                  if (nStates + -1 == iVar9) {
                    return p;
                  }
                  iVar9 = iVar9 + 1;
                }
                uVar12 = uVar6;
              } while ((int)uVar6 < (int)uVar10);
            }
          }
          uVar1 = uVar4;
        } while (uVar4 != uVar10);
      }
      uVar13 = uVar3;
    } while (uVar3 != uVar10);
  }
switchD_007d42cf_default:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                ,200,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
}

Assistant:

Vec_Vec_t * Gia_ManAssignCodes( int kHot, int nStates, int * pnBits )
{
    Vec_Vec_t * vCodes;
    int s, i1, i2, i3, i4, i5, nBits;
    assert( nStates > 0 );
    assert( kHot >= 1 && kHot <= 5 );
    vCodes = Vec_VecStart( nStates );
    *pnBits = -1;
    if ( kHot == 1 )
    {
        for ( i1 = 0; i1 < nStates; i1++ )
            Vec_VecPushInt( vCodes, i1, i1 );
        *pnBits = nStates;
        return vCodes;
    }
    if ( kHot == 2 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) / 2 >= nStates )
                break;
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 3 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) / 6 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 4 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) * (nBits-3) / 24 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        for ( i4 = i3 + 1; i4 < nBits; i4++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            Vec_VecPushInt( vCodes, s, i4 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 5 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) * (nBits-3) * (nBits-4) / 120 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        for ( i4 = i3 + 1; i4 < nBits; i4++ )
        for ( i5 = i4 + 1; i5 < nBits; i5++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            Vec_VecPushInt( vCodes, s, i4 );
            Vec_VecPushInt( vCodes, s, i5 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    assert( 0 );
    return NULL;
}